

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

MethodHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string,category_const&>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_category_ptr *f)

{
  jsonrpccxx *local_28;
  undefined8 uStack_20;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28 = (jsonrpccxx *)0x0;
  uStack_20 = 0;
  if (this != (jsonrpccxx *)0x0) {
    pcStack_10 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_category_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_category_&)>
               ::_M_manager;
    local_28 = this;
  }
  GetHandle<std::__cxx11::string,category_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&local_28,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
              *)f);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (*f)(ParamTypes...)) {
    return GetHandle(std::function<ReturnType(ParamTypes...)>(f));
  }